

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ArrayFeatureType::MergeFrom(ArrayFeatureType *this,ArrayFeatureType *from)

{
  DefaultOptionalValueUnion DVar1;
  uint32_t uVar2;
  int32_t iVar3;
  ulong uVar4;
  LogMessage *other;
  ArrayFeatureType_EnumeratedShapes *this_00;
  ArrayFeatureType_ShapeRange *this_01;
  undefined1 *puVar5;
  Arena *pAVar6;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/FeatureTypes.pb.cc"
               ,0xbbe);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<long>::MergeFrom(&this->shape_,&from->shape_);
  if (from->datatype_ != 0) {
    this->datatype_ = from->datatype_;
  }
  if (from->_oneof_case_[0] != 0x1f) {
    if (from->_oneof_case_[0] != 0x15) goto LAB_001f7b1a;
    if (this->_oneof_case_[0] == 0x15) {
      this_00 = (this->ShapeFlexibility_).enumeratedshapes_;
LAB_001f7abf:
      puVar5 = (undefined1 *)(from->ShapeFlexibility_).enumeratedshapes_;
    }
    else {
      clear_ShapeFlexibility(this);
      this->_oneof_case_[0] = 0x15;
      uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar6 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar6 = *(Arena **)pAVar6;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>(pAVar6)
      ;
      (this->ShapeFlexibility_).enumeratedshapes_ = this_00;
      if (from->_oneof_case_[0] == 0x15) goto LAB_001f7abf;
      puVar5 = _ArrayFeatureType_EnumeratedShapes_default_instance_;
    }
    ArrayFeatureType_EnumeratedShapes::MergeFrom
              (this_00,(ArrayFeatureType_EnumeratedShapes *)puVar5);
    goto LAB_001f7b1a;
  }
  if (this->_oneof_case_[0] == 0x1f) {
    this_01 = (this->ShapeFlexibility_).shaperange_;
LAB_001f7afa:
    puVar5 = (undefined1 *)(from->ShapeFlexibility_).shaperange_;
  }
  else {
    clear_ShapeFlexibility(this);
    this->_oneof_case_[0] = 0x1f;
    uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    this_01 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>(pAVar6);
    (this->ShapeFlexibility_).shaperange_ = this_01;
    if (from->_oneof_case_[0] == 0x1f) goto LAB_001f7afa;
    puVar5 = _ArrayFeatureType_ShapeRange_default_instance_;
  }
  ArrayFeatureType_ShapeRange::MergeFrom(this_01,(ArrayFeatureType_ShapeRange *)puVar5);
LAB_001f7b1a:
  uVar2 = from->_oneof_case_[1];
  if (uVar2 == 0x3d) {
    DVar1 = from->defaultOptionalValue_;
    if (this->_oneof_case_[1] != 0x3d) {
      this->_oneof_case_[1] = 0x3d;
    }
    this->defaultOptionalValue_ = DVar1;
  }
  else if (uVar2 == 0x33) {
    iVar3 = (from->defaultOptionalValue_).intdefaultvalue_;
    if (this->_oneof_case_[1] != 0x33) {
      this->_oneof_case_[1] = 0x33;
    }
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar3;
  }
  else if (uVar2 == 0x29) {
    iVar3 = (from->defaultOptionalValue_).intdefaultvalue_;
    if (this->_oneof_case_[1] != 0x29) {
      this->_oneof_case_[1] = 0x29;
    }
    (this->defaultOptionalValue_).intdefaultvalue_ = iVar3;
  }
  uVar4 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar4 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void ArrayFeatureType::MergeFrom(const ArrayFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ArrayFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  shape_.MergeFrom(from.shape_);
  if (from._internal_datatype() != 0) {
    _internal_set_datatype(from._internal_datatype());
  }
  switch (from.ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      _internal_mutable_enumeratedshapes()->::CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom(from._internal_enumeratedshapes());
      break;
    }
    case kShapeRange: {
      _internal_mutable_shaperange()->::CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom(from._internal_shaperange());
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (from.defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      _internal_set_intdefaultvalue(from._internal_intdefaultvalue());
      break;
    }
    case kFloatDefaultValue: {
      _internal_set_floatdefaultvalue(from._internal_floatdefaultvalue());
      break;
    }
    case kDoubleDefaultValue: {
      _internal_set_doubledefaultvalue(from._internal_doubledefaultvalue());
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}